

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t line_cols(Terminal *term,termline *ldata)

{
  wchar_t local_1c;
  wchar_t cols;
  termline *ldata_local;
  Terminal *term_local;
  
  local_1c = term->cols;
  if ((ldata->trusted & 1U) != 0) {
    local_1c = local_1c + L'\xfffffffd';
  }
  if ((ldata->lattr & 0x20) != 0) {
    local_1c = local_1c + L'\xffffffff';
  }
  if (local_1c < L'\0') {
    local_1c = L'\0';
  }
  return local_1c;
}

Assistant:

static int line_cols(Terminal *term, termline *ldata)
{
    int cols = term->cols;
    if (ldata->trusted) {
        cols -= TRUST_SIGIL_WIDTH;
    }
    if (ldata->lattr & LATTR_WRAPPED2)
        cols--;
    if (cols < 0)
        cols = 0;
    return cols;
}